

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * cmFileAPICodemodelDump
                  (Value *__return_storage_ptr__,cmFileAPI *fileAPI,unsigned_long version)

{
  undefined1 local_30 [8];
  Codemodel codemodel;
  unsigned_long version_local;
  cmFileAPI *fileAPI_local;
  
  codemodel.Version = version;
  anon_unknown.dwarf_1720d61::Codemodel::Codemodel((Codemodel *)local_30,fileAPI,version);
  anon_unknown.dwarf_1720d61::Codemodel::Dump(__return_storage_ptr__,(Codemodel *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPICodemodelDump(cmFileAPI& fileAPI, unsigned long version)
{
  Codemodel codemodel(fileAPI, version);
  return codemodel.Dump();
}